

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall jessilib::config::set_data(config *this,object *in_data)

{
  lock_guard<std::shared_mutex> local_20;
  lock_guard<std::shared_mutex> guard;
  object *in_data_local;
  config *this_local;
  
  guard._M_device = (mutex_type *)in_data;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_20,&this->m_mutex);
  object::operator=(&this->m_data,(object *)guard._M_device);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void config::set_data(const object& in_data) {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };
	m_data = in_data;
}